

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

Result __thiscall
presolve::HPresolve::liftingForProbing(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  int iVar1;
  __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
  end;
  initializer_list<std::pair<HighsCliqueTable::CliqueVar,_double>_> __l;
  __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
  begin;
  bool bVar2;
  HighsInt HVar3;
  pointer pHVar4;
  reference pvVar5;
  reference pvVar6;
  int *piVar7;
  mapped_type *pmVar8;
  size_type sVar9;
  unsigned_long *puVar10;
  __tuple_element_t<0UL,_tuple<int,_vector<pair<CliqueVar,_double>,_allocator<pair<CliqueVar,_double>_>_>,_double,_int>_>
  *p_Var11;
  __tuple_element_t<3UL,_tuple<int,_vector<pair<CliqueVar,_double>,_allocator<pair<CliqueVar,_double>_>_>,_double,_int>_>
  *p_Var12;
  type *ptVar13;
  reference pvVar14;
  long *in_RDI;
  pair<HighsCliqueTable::CliqueVar,_double> pVar15;
  double *coeff;
  type *cliquevar_2;
  pair<HighsCliqueTable::CliqueVar,_double> *elm_2;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  __tuple_element_t<1UL,_tuple<int,_vector<pair<CliqueVar,_double>,_allocator<pair<CliqueVar,_double>_>_>,_double,_int>_>
  *__range2_1;
  HighsCDouble update;
  size_t newfill;
  __tuple_element_t<1UL,_tuple<int,_vector<pair<CliqueVar,_double>,_allocator<pair<CliqueVar,_double>_>_>,_double,_int>_>
  *bestclique_1;
  HighsInt row_1;
  tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
  *lifting;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
  *__range1_1;
  size_t maxnfill;
  size_t numrowsmodified;
  size_t nmod;
  size_t nfill;
  anon_class_8_1_0b815314 computeOverallScore;
  CliqueVar *cliquevar_1;
  const_iterator __end5;
  const_iterator __begin5;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *__range5;
  CliqueVar *cliquevar;
  const_iterator __end4;
  const_iterator __begin4;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *__range4;
  HighsInt nfill_1;
  HighsCDouble score_1;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *clique;
  iterator __end3;
  iterator __begin3;
  vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
  *__range3;
  vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
  cliques;
  double score;
  pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_> *elm_1;
  iterator __end2;
  iterator __begin2;
  map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
  *__range2;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> candidates;
  anon_class_8_1_8991fb9c computeCoeffDiff;
  HighsInt bestnfill;
  double bestscore;
  vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
  bestclique;
  Result __result;
  bool isredundant;
  HighsHashTree<std::pair<int,_int>,_double> *htree;
  bool dense;
  HighsInt row;
  pair<const_int,_HighsHashTree<std::pair<int,_int>,_double>_> *elm;
  iterator __end1;
  iterator __begin1;
  unordered_map<int,_HighsHashTree<std::pair<int,_int>,_double>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_HighsHashTree<std::pair<int,_int>,_double>_>_>_>
  *__range1;
  size_t numrowsremoved;
  map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
  coefficients;
  key_compare comp;
  bool fillallowed;
  double bestscoretotal;
  vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
  liftingtable;
  HighsDomain *domain;
  HighsCliqueTable *cliquetable;
  undefined4 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  HPresolve *in_stack_fffffffffffffc20;
  value_type *in_stack_fffffffffffffc28;
  anon_class_8_1_d757357c in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc38;
  HighsInt in_stack_fffffffffffffc3c;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  key_compare *in_stack_fffffffffffffc48;
  map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
  *in_stack_fffffffffffffc50;
  reference in_stack_fffffffffffffc58;
  mapped_type *in_stack_fffffffffffffc60;
  HighsLp *in_stack_fffffffffffffc90;
  mapped_type *in_stack_fffffffffffffc98;
  HPresolve *in_stack_fffffffffffffca0;
  HPresolve *in_stack_fffffffffffffca8;
  __normal_iterator<const_std::pair<HighsCliqueTable::CliqueVar,_double>_*,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>_>
  local_2f0;
  vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
  *local_2e8;
  HighsCDouble local_2e0;
  long local_2d0;
  vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
  *local_2c8;
  __tuple_element_t<0UL,_tuple<int,_vector<pair<CliqueVar,_double>,_allocator<pair<CliqueVar,_double>_>_>,_double,_int>_>
  local_2bc;
  reference local_2b8;
  tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
  *local_2b0;
  __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
  local_2a8;
  vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
  *local_2a0;
  ulong local_298;
  unsigned_long local_290;
  unsigned_long local_288;
  ulong local_280;
  long local_278;
  ulong local_270;
  double in_stack_fffffffffffffd98;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
  *in_stack_fffffffffffffda0;
  HighsCliqueTable *in_stack_fffffffffffffda8;
  __normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  local_238;
  reference local_230;
  reference local_228;
  CliqueVar *local_220;
  __normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  local_218;
  reference local_210;
  uint local_204;
  HighsCDouble local_200;
  reference local_1f0;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *local_1e8;
  __normal_iterator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_*,_std::vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>_>
  local_1e0;
  undefined1 *local_1d8;
  undefined1 local_1d0 [24];
  CliqueVar local_1b8 [2];
  HPresolve *local_1b0;
  CliqueVar *local_1a8;
  undefined8 local_1a0;
  double local_198;
  reference local_190;
  _Self local_188;
  _Self local_180;
  undefined1 *local_178;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> local_170;
  uint local_14c;
  double local_148 [4];
  undefined4 local_128;
  Result local_124;
  int *local_118;
  byte *local_110;
  HighsHashTree<std::pair<int,_int>,_double> *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  HighsDomain *local_f0;
  undefined1 *local_e8;
  byte local_d9;
  HighsHashTree<std::pair<int,_int>,_double> *local_d8;
  int local_d0 [2];
  undefined1 local_c5;
  int local_c4;
  reference local_c0;
  _Node_iterator_base<std::pair<const_int,_HighsHashTree<std::pair<int,_int>,_double>_>,_false>
  local_b8;
  _Node_iterator_base<std::pair<const_int,_HighsHashTree<std::pair<int,_int>,_double>_>,_false>
  local_b0;
  long *local_a8;
  ulong local_a0;
  undefined1 local_90 [55];
  undefined1 local_59;
  double local_58 [3];
  vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
  local_40;
  HighsDomain *local_28;
  HighsCliqueTable *local_20;
  Result local_4;
  
  pHVar4 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x6fb1b7);
  local_20 = &pHVar4->cliquetable;
  pHVar4 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x6fb1e1);
  local_28 = &pHVar4->domain;
  std::
  vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
  ::vector((vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
            *)0x6fb204);
  std::
  unordered_map<int,_HighsHashTree<std::pair<int,_int>,_double>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_HighsHashTree<std::pair<int,_int>,_double>_>_>_>
  ::size((unordered_map<int,_HighsHashTree<std::pair<int,_int>,_double>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_HighsHashTree<std::pair<int,_int>,_double>_>_>_>
          *)0x6fb218);
  std::
  vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
  ::reserve((vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
             *)in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
  local_58[0] = -INFINITY;
  local_59 = 0 < *(int *)(*(long *)(in_RDI[3] + 8) + 0x37c);
  std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>::allocator
            ((allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_> *)
             0x6fb271);
  std::
  map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
  ::map(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
        (allocator_type *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
  std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>::~allocator
            ((allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_> *)
             0x6fb29d);
  local_a0 = 0;
  local_a8 = in_RDI + 0xa1;
  local_b0._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_HighsHashTree<std::pair<int,_int>,_double>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_HighsHashTree<std::pair<int,_int>,_double>_>_>_>
       ::begin((unordered_map<int,_HighsHashTree<std::pair<int,_int>,_double>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_HighsHashTree<std::pair<int,_int>,_double>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  local_b8._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_HighsHashTree<std::pair<int,_int>,_double>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_HighsHashTree<std::pair<int,_int>,_double>_>_>_>
       ::end((unordered_map<int,_HighsHashTree<std::pair<int,_int>,_double>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_HighsHashTree<std::pair<int,_int>,_double>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  while (bVar2 = std::__detail::operator!=(&local_b0,&local_b8), bVar2) {
    local_c0 = std::__detail::
               _Node_iterator<std::pair<const_int,_HighsHashTree<std::pair<int,_int>,_double>_>,_false,_false>
               ::operator*((_Node_iterator<std::pair<const_int,_HighsHashTree<std::pair<int,_int>,_double>_>,_false,_false>
                            *)0x6fb314);
    local_c4 = local_c0->first;
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xb9),
                        (long)local_c4);
    if (*pvVar5 == '\0') {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)local_c4);
      iVar1 = *pvVar6;
      local_d0[1] = 1000;
      local_d0[0] = (*(int *)*in_RDI - *(int *)((long)in_RDI + 0x624)) / 0x14;
      piVar7 = std::max<int>(local_d0 + 1,local_d0);
      local_c5 = *piVar7 < iVar1;
      local_108 = &local_c0->second;
      local_d9 = 0;
      local_118 = &local_c4;
      local_110 = &local_d9;
      local_100 = &local_c5;
      local_f8 = &local_59;
      local_f0 = local_28;
      local_e8 = local_90;
      local_d8 = local_108;
      HighsHashTree<std::pair<int,int>,double>::
      for_each<presolve::HPresolve::liftingForProbing(presolve::HighsPostsolveStack&)::__1>
                ((HighsHashTree<std::pair<int,_int>,_double> *)in_stack_fffffffffffffc20,
                 (anon_class_64_8_9ac467b2 *)
                 CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
      if ((local_d9 & 1) == 0) {
        bVar2 = std::
                map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                ::empty((map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                         *)0x6fb5be);
        if (!bVar2) {
          std::
          vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
          ::vector((vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                    *)0x6fb5d6);
          local_148[0] = -INFINITY;
          local_14c = 0;
          std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          vector((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  *)0x6fb618);
          std::
          map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
          ::size((map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                  *)0x6fb625);
          std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          reserve((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   *)in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
          local_178 = local_90;
          local_180._M_node =
               (_Base_ptr)
               std::
               map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
               ::begin((map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
          local_188._M_node =
               (_Base_ptr)
               std::
               map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
               ::end((map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
          while (bVar2 = std::operator!=(&local_180,&local_188), bVar2) {
            local_190 = std::
                        _Rb_tree_iterator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>
                        ::operator*((_Rb_tree_iterator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>
                                     *)0x6fb69c);
            std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
            push_back((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       *)in_stack_fffffffffffffc30.computeOverallScore,in_stack_fffffffffffffc28);
            local_198 = liftingForProbing::anon_class_8_1_8991fb9c::operator()
                                  ((anon_class_8_1_8991fb9c *)
                                   CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                                   (double)CONCAT44(in_stack_fffffffffffffc3c,
                                                    in_stack_fffffffffffffc38),
                                   (HighsInt)
                                   ((ulong)in_stack_fffffffffffffc30.computeOverallScore >> 0x20));
            if (local_148[0] < local_198) {
              local_14c = (uint)((local_190->second).second == -1);
              local_148[0] = local_198;
              pVar15 = std::make_pair<HighsCliqueTable::CliqueVar_const&,double_const&>
                                 ((CliqueVar *)in_stack_fffffffffffffc20,
                                  (double *)
                                  CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
              in_stack_fffffffffffffca8 = (HPresolve *)pVar15.second;
              local_1b8[0] = pVar15.first;
              local_1a8 = local_1b8;
              local_1a0 = 1;
              __l._M_array._4_4_ = in_stack_fffffffffffffc3c;
              __l._M_array._0_4_ = in_stack_fffffffffffffc38;
              __l._M_len._0_4_ = in_stack_fffffffffffffc40;
              __l._M_len._4_4_ = in_stack_fffffffffffffc44;
              local_1b0 = in_stack_fffffffffffffca8;
              std::
              vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
              ::operator=((vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                           *)in_stack_fffffffffffffc30.computeOverallScore,__l);
            }
            std::
            _Rb_tree_iterator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>
            ::operator++((_Rb_tree_iterator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>
                          *)in_stack_fffffffffffffc20);
          }
          sVar9 = std::
                  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  ::size(&local_170);
          if (1 < sVar9) {
            HighsCliqueTable::computeMaximalCliques
                      (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98
                      );
            local_1d8 = local_1d0;
            local_1e0._M_current =
                 (vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  *)std::
                    vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                    ::begin((vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
            local_1e8 = (vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                         *)std::
                           vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                           ::end((vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
            while (bVar2 = __gnu_cxx::operator!=
                                     ((__normal_iterator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_*,_std::vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>_>
                                       *)in_stack_fffffffffffffc20,
                                      (__normal_iterator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_*,_std::vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>_>
                                       *)CONCAT44(in_stack_fffffffffffffc1c,
                                                  in_stack_fffffffffffffc18)), bVar2) {
              local_1f0 = __gnu_cxx::
                          __normal_iterator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_*,_std::vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>_>
                          ::operator*(&local_1e0);
              HighsCDouble::HighsCDouble(&local_200,0.0);
              local_204 = 0;
              local_210 = local_1f0;
              local_218._M_current =
                   (CliqueVar *)
                   std::
                   vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ::begin((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
              local_220 = (CliqueVar *)
                          std::
                          vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          ::end((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                 *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
              while (bVar2 = __gnu_cxx::operator!=
                                       ((__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                                         *)in_stack_fffffffffffffc20,
                                        (__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                                         *)CONCAT44(in_stack_fffffffffffffc1c,
                                                    in_stack_fffffffffffffc18)), bVar2) {
                local_228 = __gnu_cxx::
                            __normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                            ::operator*(&local_218);
                in_stack_fffffffffffffca0 =
                     (HPresolve *)
                     std::
                     map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                     ::operator[]((map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                                   *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
                in_stack_fffffffffffffc90 = in_stack_fffffffffffffca0->model;
                in_stack_fffffffffffffc98 =
                     std::
                     map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                     ::operator[]((map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                                   *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
                liftingForProbing::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)
                           CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                           (double)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                           (HighsInt)((ulong)in_stack_fffffffffffffc30.computeOverallScore >> 0x20))
                ;
                HighsCDouble::operator+=
                          ((HighsCDouble *)in_stack_fffffffffffffc30.computeOverallScore,
                           (double)in_stack_fffffffffffffc28);
                pmVar8 = std::
                         map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                         ::operator[]((map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                                       *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
                if (pmVar8->second == -1) {
                  local_204 = local_204 + 1;
                }
                __gnu_cxx::
                __normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                ::operator++(&local_218);
              }
              bVar2 = HighsCDouble::operator>
                                ((HighsCDouble *)in_stack_fffffffffffffc20,
                                 (double)CONCAT44(in_stack_fffffffffffffc1c,
                                                  in_stack_fffffffffffffc18));
              if (bVar2) {
                local_148[0] = HighsCDouble::operator_cast_to_double(&local_200);
                local_14c = local_204;
                std::
                vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                ::clear((vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                         *)0x6fba90);
                std::
                vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
                size(local_1f0);
                std::
                vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                ::reserve((vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                           *)in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
                local_230 = local_1f0;
                local_238._M_current =
                     (CliqueVar *)
                     std::
                     vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ::begin((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                              *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
                std::
                vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
                end((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
                while (bVar2 = __gnu_cxx::operator!=
                                         ((__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                                           *)in_stack_fffffffffffffc20,
                                          (__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                                           *)CONCAT44(in_stack_fffffffffffffc1c,
                                                      in_stack_fffffffffffffc18)), bVar2) {
                  in_stack_fffffffffffffc58 =
                       __gnu_cxx::
                       __normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                       ::operator*(&local_238);
                  in_stack_fffffffffffffc60 =
                       std::
                       map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                       ::operator[]((map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                                     *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
                  std::
                  vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>
                  ::emplace_back<HighsCliqueTable::CliqueVar_const&,double&>
                            ((vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                              *)in_stack_fffffffffffffc30.computeOverallScore,
                             in_stack_fffffffffffffc28,(double *)in_stack_fffffffffffffc20);
                  __gnu_cxx::
                  __normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                  ::operator++(&local_238);
                }
              }
              __gnu_cxx::
              __normal_iterator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_*,_std::vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>_>
              ::operator++(&local_1e0);
            }
            std::
            vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
            ::~vector((vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                       *)in_stack_fffffffffffffc30.computeOverallScore);
          }
          std::
          vector<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>,std::allocator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>>>
          ::
          emplace_back<int&,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>&,double&,int&>
                    ((vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
                      *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                     (int *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                     (vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                      *)in_stack_fffffffffffffc30.computeOverallScore,
                     (double *)in_stack_fffffffffffffc28,(int *)in_stack_fffffffffffffc20);
          in_stack_fffffffffffffc50 =
               (map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                *)std::max<double>(local_58,local_148);
          local_58[0] = *(double *)&(in_stack_fffffffffffffc50->_M_t)._M_impl;
          std::
          map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
          ::clear((map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                   *)0x6fbbee);
          std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          ~vector((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   *)in_stack_fffffffffffffc30.computeOverallScore);
          std::
          vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
          ::~vector((vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                     *)in_stack_fffffffffffffc30.computeOverallScore);
        }
      }
      else {
        local_a0 = local_a0 + 1;
        HighsPostsolveStack::redundantRow
                  ((HighsPostsolveStack *)in_stack_fffffffffffffc30.computeOverallScore,
                   (HighsInt)((ulong)in_stack_fffffffffffffc28 >> 0x20));
        removeRow((HPresolve *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                  in_stack_fffffffffffffc3c);
        std::
        map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
        ::clear((map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                 *)0x6fb53b);
        local_124 = checkLimits(in_stack_fffffffffffffca8,
                                (HighsPostsolveStack *)in_stack_fffffffffffffca0);
        local_4 = local_124;
        if (local_124 != kOk) goto LAB_006fc0e7;
      }
    }
    std::__detail::
    _Node_iterator<std::pair<const_int,_HighsHashTree<std::pair<int,_int>,_double>_>,_false,_false>
    ::operator++((_Node_iterator<std::pair<const_int,_HighsHashTree<std::pair<int,_int>,_double>_>,_false,_false>
                  *)in_stack_fffffffffffffc20);
  }
  std::
  vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
  ::begin((vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
           *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  std::
  vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
  ::end((vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
         *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  begin._M_current._4_4_ = in_stack_fffffffffffffc44;
  begin._M_current._0_4_ = in_stack_fffffffffffffc40;
  end._M_current._4_4_ = in_stack_fffffffffffffc3c;
  end._M_current._0_4_ = in_stack_fffffffffffffc38;
  pdqsort<__gnu_cxx::__normal_iterator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>*,std::vector<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>,std::allocator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>>>>,presolve::HPresolve::liftingForProbing(presolve::HighsPostsolveStack&)::__3>
            (begin,end,in_stack_fffffffffffffc30);
  local_270 = 0;
  local_278 = 0;
  local_280 = 0;
  sVar9 = std::
          vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
          ::size(&local_40);
  local_290 = sVar9 * 10;
  HVar3 = numNonzeros(in_stack_fffffffffffffc20);
  local_298 = (ulong)(long)HVar3 / 100;
  puVar10 = std::max<unsigned_long>(&local_290,&local_298);
  local_288 = *puVar10;
  local_2a0 = &local_40;
  local_2a8._M_current =
       (tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        *)std::
          vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
          ::begin((vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
                   *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  local_2b0 = (tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
               *)std::
                 vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
                 ::end((vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
                        *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
                             *)in_stack_fffffffffffffc20,
                            (__normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18)), bVar2
        ) {
    local_2b8 = __gnu_cxx::
                __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
                ::operator*(&local_2a8);
    p_Var11 = std::
              get<0ul,int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>
                        ((tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                          *)0x6fbdc0);
    local_2bc = *p_Var11;
    local_2c8 = std::
                get<1ul,int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>
                          ((tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                            *)0x6fbdd6);
    p_Var12 = std::
              get<3ul,int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>
                        ((tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                          *)0x6fbdeb);
    local_2d0 = (long)*p_Var12;
    if (local_288 < local_270 + local_2d0) break;
    local_270 = local_270 + local_2d0;
    sVar9 = std::
            vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
            ::size(local_2c8);
    local_278 = local_278 + (sVar9 - local_2d0);
    HighsCDouble::HighsCDouble(&local_2e0,0.0);
    local_2e8 = local_2c8;
    local_2f0._M_current =
         (pair<HighsCliqueTable::CliqueVar,_double> *)
         std::
         vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
         ::begin((vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                  *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
    std::
    vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
    ::end((vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
           *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::pair<HighsCliqueTable::CliqueVar,_double>_*,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>_>
                               *)in_stack_fffffffffffffc20,
                              (__normal_iterator<const_std::pair<HighsCliqueTable::CliqueVar,_double>_*,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18)),
          bVar2) {
      __gnu_cxx::
      __normal_iterator<const_std::pair<HighsCliqueTable::CliqueVar,_double>_*,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>_>
      ::operator*(&local_2f0);
      ptVar13 = std::get<0ul,HighsCliqueTable::CliqueVar,double>
                          ((pair<HighsCliqueTable::CliqueVar,_double> *)0x6fbeea);
      std::get<1ul,HighsCliqueTable::CliqueVar,double>
                ((pair<HighsCliqueTable::CliqueVar,_double> *)0x6fbeff);
      addToMatrix(in_stack_fffffffffffffca0,(HighsInt)((ulong)in_stack_fffffffffffffc98 >> 0x20),
                  (HighsInt)in_stack_fffffffffffffc98,(double)in_stack_fffffffffffffc90);
      if (-1 < (int)*ptVar13) {
        HighsCDouble::operator+=
                  ((HighsCDouble *)in_stack_fffffffffffffc30.computeOverallScore,
                   (double)in_stack_fffffffffffffc28);
      }
      __gnu_cxx::
      __normal_iterator<const_std::pair<HighsCliqueTable::CliqueVar,_double>_*,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>_>
      ::operator++(&local_2f0);
    }
    local_280 = local_280 + 1;
    pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x50),(long)local_2bc
                        );
    if ((*pvVar14 != -INFINITY) || (NAN(*pvVar14))) {
      in_stack_fffffffffffffc30.computeOverallScore =
           (anon_class_8_1_0b815314 *)HighsCDouble::operator_cast_to_double(&local_2e0);
      pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x50),
                           (long)local_2bc);
      *pvVar14 = (double)in_stack_fffffffffffffc30.computeOverallScore + *pvVar14;
    }
    pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x68),(long)local_2bc
                        );
    if ((*pvVar14 != INFINITY) || (NAN(*pvVar14))) {
      in_stack_fffffffffffffc28 = (value_type *)HighsCDouble::operator_cast_to_double(&local_2e0);
      pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x68),
                           (long)local_2bc);
      *pvVar14 = (double)in_stack_fffffffffffffc28 + *pvVar14;
    }
    __gnu_cxx::
    __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
    ::operator++(&local_2a8);
  }
  highsLogDev((HighsLogOptions *)(in_RDI[1] + 0x380),kInfo,
              "Lifting for probing removed %d and modified %d row(s), added %d new and modified %d existing nonzero(s)\n"
              ,local_a0 & 0xffffffff,local_280 & 0xffffffff,local_270 & 0xffffffff,
              (undefined4)local_278);
  local_4 = kOk;
LAB_006fc0e7:
  local_128 = 1;
  std::
  map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
  ::~map((map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
          *)0x6fc0f4);
  std::
  vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
  ::~vector((vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
             *)in_stack_fffffffffffffc30.computeOverallScore);
  return local_4;
}

Assistant:

HPresolve::Result HPresolve::liftingForProbing(
    HighsPostsolveStack& postsolve_stack) {
  // this method implements lifting for probing as described by Achterberg et
  // al. (2019) Presolve Reductions in Mixed Integer Programming. INFORMS
  // Journal on Computing 32(2):473-506.
  HighsCliqueTable& cliquetable = mipsolver->mipdata_->cliquetable;
  const HighsDomain& domain = mipsolver->mipdata_->domain;

  // collect best lifting opportunity for each row in a vector
  typedef std::pair<HighsCliqueTable::CliqueVar, double> liftingvar;
  typedef std::tuple<HighsInt, std::vector<liftingvar>, double, HighsInt>
      liftingdata;
  std::vector<liftingdata> liftingtable;
  liftingtable.reserve(liftingOpportunities.size());

  // remember overall best score
  double bestscoretotal = -kHighsInf;

  // is lifting allowed to add non-zeros?
  const bool fillallowed = mipsolver->options_mip_->mip_lifting_for_probing > 0;

  // store clique variables and coefficients in a map
  auto comp = [](const HighsCliqueTable::CliqueVar& c1,
                 const HighsCliqueTable::CliqueVar& c2) {
    return c1.col < c2.col || (c1.col == c2.col && c1.val < c2.val);
  };
  std::map<HighsCliqueTable::CliqueVar, std::pair<double, HighsInt>,
           decltype(comp)>
      coefficients(comp);

  // consider lifting opportunities
  size_t numrowsremoved = 0;
  for (const auto& elm : liftingOpportunities) {
    // get row index and skip deleted rows
    HighsInt row = elm.first;
    if (rowDeleted[row]) continue;

    // do not add non-zeros to dense rows
    const bool dense =
        rowsize[row] >
        std::max(HighsInt{1000}, (model->num_col_ - numDeletedCols) / 20);

    // iterate over elements in hash tree
    const auto& htree = elm.second;
    bool isredundant = false;
    htree.for_each([&](const std::pair<HighsInt, HighsInt>& data, double coef) {
      HighsInt col = data.first;
      HighsInt val = data.second;
      HighsInt pos = findNonzero(row, col);
      isredundant = isredundant || htree.contains(std::make_pair(col, 1 - val));
      if (!dense && (fillallowed || pos != -1) && !colDeleted[col] &&
          !domain.isFixed(col))
        coefficients[HighsCliqueTable::CliqueVar{col, val}] = {coef, pos};
    });

    // remove redundant rows
    if (isredundant) {
      numrowsremoved++;
      postsolve_stack.redundantRow(row);
      removeRow(row);
      coefficients.clear();
      HPRESOLVE_CHECKED_CALL(checkLimits(postsolve_stack));
      continue;
    }

    // skip rows with empty coefficient map
    if (coefficients.empty()) continue;

    // vector to hold best clique
    std::vector<liftingvar> bestclique;
    double bestscore = -kHighsInf;
    HighsInt bestnfill = 0;

    // lambda for computing coefficient difference
    auto computeCoeffDiff = [&](double newvalue, HighsInt nzpos) {
      return std::fabs(newvalue - (nzpos == -1 ? 0 : Avalue[nzpos]));
    };

    // store candidates in a vector
    std::vector<HighsCliqueTable::CliqueVar> candidates;
    candidates.reserve(coefficients.size());
    for (const auto& elm : coefficients) {
      candidates.push_back(elm.first);
      // initialize best clique
      double score = computeCoeffDiff(elm.second.first, elm.second.second);
      if (score > bestscore) {
        bestscore = score;
        bestnfill = elm.second.second == -1 ? 1 : 0;
        bestclique = {std::make_pair(elm.first, elm.second.first)};
      }
    }

    if (candidates.size() > 1) {
      // compute cliques
      auto cliques =
          cliquetable.computeMaximalCliques(candidates, primal_feastol);

      // identify clique with highest score
      for (const auto& clique : cliques) {
        HighsCDouble score = 0;
        HighsInt nfill = 0;
        for (const auto& cliquevar : clique) {
          score += computeCoeffDiff(coefficients[cliquevar].first,
                                    coefficients[cliquevar].second);
          if (coefficients[cliquevar].second == -1) nfill++;
        }
        if (score > bestscore) {
          bestscore = static_cast<double>(score);
          bestnfill = nfill;
          bestclique.clear();
          bestclique.reserve(clique.size());
          for (const auto& cliquevar : clique) {
            bestclique.emplace_back(cliquevar, coefficients[cliquevar].first);
          }
        }
      }
    }

    // store best clique
    liftingtable.emplace_back(row, bestclique, bestscore, bestnfill);
    bestscoretotal = std::max(bestscoretotal, bestscore);
    coefficients.clear();
  }

  // lambda for computing score
  auto computeOverallScore = [&](double score, HighsInt numelms,
                                 HighsInt numfillin) {
    const double weight = 0.5;
    return weight * (score / bestscoretotal) +
           (1 - weight) * static_cast<double>(numelms - numfillin) /
               static_cast<double>(numelms);
  };

  // sort according to score
  pdqsort(
      liftingtable.begin(), liftingtable.end(),
      [&](const liftingdata& opp1, const liftingdata& opp2) {
        double score1 = computeOverallScore(
            std::get<2>(opp1), static_cast<HighsInt>(std::get<1>(opp1).size()),
            std::get<3>(opp1));
        double score2 = computeOverallScore(
            std::get<2>(opp2), static_cast<HighsInt>(std::get<1>(opp2).size()),
            std::get<3>(opp2));
        return (score1 == score2 ? std::get<0>(opp1) < std::get<0>(opp2)
                                 : score1 > score2);
      });

  // perform actual lifting
  size_t nfill = 0;
  size_t nmod = 0;
  size_t numrowsmodified = 0;
  const size_t maxnfill = std::max(10 * liftingtable.size(),
                                   static_cast<size_t>(numNonzeros()) / 100);
  for (const auto& lifting : liftingtable) {
    // get clique
    HighsInt row = std::get<0>(lifting);
    const auto& bestclique = std::get<1>(lifting);

    // check against max. fill-in
    size_t newfill = static_cast<size_t>(std::get<3>(lifting));
    if (nfill + newfill > maxnfill) break;
    nfill += newfill;
    nmod += bestclique.size() - newfill;

    // update matrix
    HighsCDouble update = 0.0;
    for (const auto& elm : bestclique) {
      // get data
      const auto& cliquevar = std::get<0>(elm);
      const double& coeff = std::get<1>(elm);
      // add non-zero to matrix
      addToMatrix(row, cliquevar.col, coeff);
      // compute term to update left-hand / right-hand side
      if (cliquevar.val == 0) update += coeff;
    }

    // update left-hand / right-hand sides
    numrowsmodified++;
    if (model->row_lower_[row] != -kHighsInf)
      model->row_lower_[row] += static_cast<double>(update);
    if (model->row_upper_[row] != kHighsInf)
      model->row_upper_[row] += static_cast<double>(update);
  }

  highsLogDev(options->log_options, HighsLogType::kInfo,
              "Lifting for probing removed %d and modified %d row(s), added %d "
              "new and modified %d existing nonzero(s)\n",
              static_cast<int>(numrowsremoved),
              static_cast<int>(numrowsmodified), static_cast<int>(nfill),
              static_cast<int>(nmod));

  return Result::kOk;
}